

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTechnique
          (OgreImporter *this,string *techniqueName,stringstream *ss,aiMaterial *material)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  Logger *pLVar4;
  stringstream *psVar5;
  string passName;
  string linePart;
  string partPass;
  string local_218;
  OgreImporter *local_1f8;
  aiMaterial *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1f8 = this;
  local_1f0 = material;
  std::operator>>((istream *)ss,(string *)&local_1e8);
  bVar1 = std::operator!=(&local_1e8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              (&local_1c8,
               (char (*) [60])"Invalid material: Technique block start missing near index ");
    std::istream::tellg();
    std::ostream::_M_insert<long>((long)&local_1c8);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,local_218._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[13]>(&local_1c8,(char (*) [13])" technique \'");
    std::operator<<((ostream *)&local_1c8,(string *)techniqueName);
    std::operator<<((ostream *)&local_1c8,"\'");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,local_218._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::__cxx11::string::string((string *)&local_1c8,"pass",(allocator *)&local_218);
    while( true ) {
      bVar2 = std::operator!=(&local_1e8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              partBlockEnd_abi_cxx11_);
      if (!bVar2) break;
      std::operator>>((istream *)ss,(string *)&local_1e8);
      _Var3 = std::operator==(&local_1e8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              partComment_abi_cxx11_);
      if (_Var3) {
        SkipLine(&local_50,ss);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        _Var3 = std::operator==(&local_1e8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1c8);
        if (_Var3) {
          psVar5 = ss;
          SkipLine(&local_218,ss);
          Trim(&local_218,SUB81(psVar5,0));
          ReadPass(local_1f8,&local_218,ss,local_1f0);
          std::__cxx11::string::~string((string *)&local_218);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  return !bVar1;
}

Assistant:

bool OgreImporter::ReadTechnique(const std::string &techniqueName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Technique block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F(" technique '", techniqueName, "'");

    const string partPass  = "pass";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        /// @todo Techniques have other attributes than just passes.
        if (linePart == partPass)
        {
            string passName = SkipLine(ss);
            ReadPass(Trim(passName), ss, material);
        }
    }
    return true;
}